

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

SizeType __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Append
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType l1,
          SizeType l2)

{
  SizeType SVar1;
  State *pSVar2;
  SizeType index;
  
  index = l1;
  while( true ) {
    pSVar2 = GetState(this,index);
    SVar1 = pSVar2->out;
    pSVar2 = GetState(this,index);
    if (SVar1 == 0xffffffff) break;
    index = pSVar2->out;
  }
  pSVar2->out = l2;
  return l1;
}

Assistant:

SizeType Append(SizeType l1, SizeType l2) {
        SizeType old = l1;
        while (GetState(l1).out != kRegexInvalidState)
            l1 = GetState(l1).out;
        GetState(l1).out = l2;
        return old;
    }